

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O3

LY_ERR schema_mount_validate
                 (lysc_ext_instance *ext,lyd_node *sibling,lyd_node *dep_tree,lyd_type data_type,
                 uint32_t val_opts,lyd_node **diff)

{
  lyd_node **pplVar1;
  ly_ctx *plVar2;
  lyd_node_inner *plVar3;
  lyd_node_inner *plVar4;
  LY_ERR err;
  LY_ERR LVar5;
  lyd_node *plVar6;
  uint32_t *opts;
  char *xpath;
  lyd_node *plVar7;
  ly_err_item *eitem;
  lys_module *plVar8;
  lyd_node **pplVar9;
  ulong uVar10;
  lyd_node_inner *plVar11;
  lysc_node *sibling_00;
  ly_set *par_set;
  ly_set *set;
  lyd_node *ext_data;
  uint32_t temp_lo;
  lyd_node *top_node;
  lyd_node *in_stack_ffffffffffffff48;
  ly_bool local_a9;
  lyd_node **local_a8;
  lyd_node *local_a0;
  ly_set *local_98;
  lyd_node_inner *local_90;
  lyd_node_inner *local_88;
  lyd_node *local_80;
  ly_set *local_78;
  lysc_node *local_70;
  lyd_node_inner *local_68;
  lyd_node_inner *local_60;
  lyd_node *local_58;
  uint32_t local_50;
  uint32_t local_4c;
  lyd_node *local_48;
  ly_ctx *local_40;
  ulong local_38;
  
  local_4c = 6;
  local_58 = (lyd_node *)0x0;
  local_a0 = sibling;
  if (sibling == (lyd_node *)0x0) {
    err = LY_EINT;
    lyplg_ext_compile_log
              ((lysc_ctx *)0x0,ext,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_exts/schema_mount.c"
               ,CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),0x393));
  }
  else {
    plVar11 = sibling->parent;
    local_80 = (lyd_node *)0x0;
    local_88 = (lyd_node_inner *)0x0;
    local_a9 = '\0';
    local_98 = (ly_set *)0x0;
    local_50 = val_opts;
    err = lyplg_ext_get_data(ext->module->ctx,ext,&local_58,&local_a9);
    plVar7 = local_58;
    if (err == LY_SUCCESS) {
      for (; local_60 = plVar11, plVar7 != (lyd_node *)0x0; plVar7 = plVar7->next) {
        if ((plVar7->flags & 4) != 0) {
          err = LY_EINVAL;
          lyplg_ext_compile_log
                    ((lysc_ctx *)0x0,ext,LY_LLERR,LY_EINVAL,
                     "Provided ext data have not been validated.");
          goto LAB_0019f579;
        }
      }
      if (local_a0->schema == (lysc_node *)0x0) {
        plVar8 = (lys_module *)&local_a0[2].schema;
      }
      else {
        plVar8 = local_a0->schema->module;
      }
      plVar2 = plVar8->ctx;
      local_68 = (lyd_node_inner *)0x0;
      local_78 = (ly_set *)0x0;
      local_90 = (lyd_node_inner *)0x0;
      local_98 = (ly_set *)0x0;
      if (local_58 == (lyd_node *)0x0) {
        err = LY_EINVAL;
        lyplg_ext_compile_log((lysc_ctx *)0x0,ext,LY_LLERR,LY_EINVAL,"No ext data provided.");
      }
      else {
        err = schema_mount_get_parent_ref(ext,local_58,(ly_set **)&local_68);
        if ((err == LY_SUCCESS) && (err = ly_set_new(&local_98), err == LY_SUCCESS)) {
          local_70 = (lysc_node *)0x0;
          if ((local_68->field_0).node.flags == 0) {
            err = LY_SUCCESS;
          }
          else {
            uVar10 = 0;
            local_a8 = diff;
            local_40 = plVar2;
            while( true ) {
              in_stack_ffffffffffffff48 = (lyd_node *)&local_78;
              plVar11 = ((anon_union_8_3_0df1e6ad_for_ly_set_2 *)&(local_68->field_0).node.schema)->
                        dnodes[uVar10][1].parent;
              local_38 = uVar10;
              xpath = lyxp_get_expr(*(lyxp_expr **)&plVar11->field_0);
              err = lyd_find_xpath3((lyd_node *)local_60,(lyd_node *)local_60,xpath,
                                    *(LY_VALUE_FORMAT *)((long)&plVar11->field_0 + 0x18),
                                    (plVar11->field_0).node.parent,(lyxp_var *)0x0,
                                    (ly_set **)in_stack_ffffffffffffff48);
              plVar2 = local_40;
              if (err != LY_SUCCESS) break;
              if (local_78->count != 0) {
                uVar10 = 0;
                do {
                  err = lyd_dup_single_to_ctx
                                  ((local_78->field_2).dnodes[uVar10],plVar2,(lyd_node_inner *)0x0,
                                   0x1d,(lyd_node **)&local_90);
                  diff = local_a8;
                  if (err != LY_SUCCESS) goto LAB_0019f6ba;
                  plVar11 = (local_90->field_0).node.parent;
                  while (plVar4 = plVar11, plVar4 != (lyd_node_inner *)0x0) {
                    local_90 = plVar4;
                    plVar11 = (plVar4->field_0).node.parent;
                  }
                  if (local_70 == (lysc_node *)0x0) {
                    local_48 = (lyd_node *)0x0;
                    sibling_00 = (lysc_node *)0x0;
LAB_0019f8dd:
                    err = lyd_insert_sibling((lyd_node *)sibling_00,(lyd_node *)local_90,
                                             (lyd_node **)&local_70);
                    diff = local_a8;
                    if (err != LY_SUCCESS) goto LAB_0019f6ba;
                    err = ly_set_add(local_98,local_90,'\x01',(uint32_t *)0x0);
                    diff = local_a8;
                  }
                  else {
                    err = lyd_find_sibling_first
                                    ((lyd_node *)local_70,(lyd_node *)local_90,&local_48);
                    if ((err != LY_SUCCESS) && (diff = local_a8, err != LY_ENOTFOUND))
                    goto LAB_0019f6ba;
                    sibling_00 = local_70;
                    if (local_48 == (lyd_node *)0x0) goto LAB_0019f8dd;
                    err = lyd_merge_tree((lyd_node **)&local_70,(lyd_node *)local_90,1);
                    local_90 = (lyd_node_inner *)0x0;
                    diff = local_a8;
                  }
                  local_a8 = diff;
                  if (err != LY_SUCCESS) goto LAB_0019f6ba;
                  local_90 = (lyd_node_inner *)0x0;
                  uVar10 = uVar10 + 1;
                } while (uVar10 < local_78->count);
              }
              uVar10 = local_38 + 1;
              err = LY_SUCCESS;
              diff = local_a8;
              if ((local_68->field_0).node.flags <= uVar10) goto LAB_0019f6ba;
            }
            lyxp_get_expr(*(lyxp_expr **)&plVar11->field_0);
            lyplg_ext_compile_log
                      ((lysc_ctx *)0x0,ext,LY_LLERR,err,"Parent reference \"%s\" evaluation failed."
                      );
            diff = local_a8;
          }
        }
      }
LAB_0019f6ba:
      ly_set_free((ly_set *)local_68,(_func_void_void_ptr *)0x0);
      ly_set_free(local_78,(_func_void_void_ptr *)0x0);
      lyd_free_tree((lyd_node *)local_90);
      plVar7 = local_a0;
      if (err == LY_SUCCESS) {
        local_a8 = diff;
        LVar5 = lyd_unlink_siblings(in_stack_ffffffffffffff48);
        err = LY_SUCCESS;
        plVar6 = local_a0;
        if (LVar5 == LY_SUCCESS) {
          for (; plVar6 != (lyd_node *)0x0; plVar6 = plVar6->next) {
            *(byte *)&plVar6->flags = (byte)plVar6->flags & 0xf7;
          }
          if ((local_98->count == 0) ||
             (err = lyd_insert_sibling(local_a0,*(local_98->field_2).dnodes,&local_a0),
             err == LY_SUCCESS)) {
            opts = ly_temp_log_options(&local_4c);
            pplVar9 = &local_80;
            if (data_type == LYD_TYPE_DATA_YANG) {
              if (local_a8 == (lyd_node **)0x0) {
                pplVar9 = (lyd_node **)0x0;
              }
              err = lyd_validate_all(&local_a0,(ly_ctx *)0x0,local_50 | 2,pplVar9);
            }
            else {
              if (local_a8 == (lyd_node **)0x0) {
                pplVar9 = (lyd_node **)0x0;
              }
              err = lyd_validate_op(plVar7,dep_tree,data_type,pplVar9);
            }
            ly_temp_log_options(opts);
            if (local_98->count != 0) {
              uVar10 = 0;
              do {
                plVar7 = (local_98->field_2).dnodes[uVar10];
                if (plVar7 == local_a0) {
                  local_a0 = local_a0->next;
                  plVar7 = (local_98->field_2).dnodes[uVar10];
                }
                lyd_free_tree(plVar7);
                uVar10 = uVar10 + 1;
              } while (uVar10 < local_98->count);
            }
            pplVar9 = local_a8;
            plVar7 = local_a0;
            if (local_a0 == (lyd_node *)0x0) {
              plVar6 = (lyd_node *)0x0;
            }
            else {
              do {
                *(byte *)&plVar7->flags = (byte)plVar7->flags | 8;
                pplVar1 = &plVar7->next;
                plVar7 = *pplVar1;
                plVar6 = local_a0;
              } while (*pplVar1 != (lyd_node *)0x0);
            }
            lyplg_ext_insert((lyd_node *)local_60,plVar6);
            if (err == LY_SUCCESS) {
              err = LY_SUCCESS;
              plVar7 = local_80;
              if (local_80 != (lyd_node *)0x0 && pplVar9 != (lyd_node **)0x0) {
                do {
                  *(byte *)&plVar7->flags = (byte)plVar7->flags | 8;
                  plVar7 = plVar7->next;
                } while (plVar7 != (lyd_node *)0x0);
                if (local_a0 == (lyd_node *)0x0) {
                  plVar11 = (lyd_node_inner *)0x0;
                }
                else {
                  plVar11 = local_a0->parent;
                }
                err = lyd_dup_single((lyd_node *)plVar11,(lyd_node_inner *)0x0,6,
                                     (lyd_node **)&local_88);
                pplVar9 = local_a8;
                if ((err == LY_SUCCESS) &&
                   (err = lyplg_ext_insert((lyd_node *)local_88,local_80), err == LY_SUCCESS)) {
                  local_80 = (lyd_node *)0x0;
                  if (local_88 == (lyd_node_inner *)0x0) {
                    plVar11 = (lyd_node_inner *)0x0;
                  }
                  else {
                    plVar4 = (local_88->field_0).node.parent;
                    plVar11 = local_88;
                    while (plVar3 = plVar4, local_88 = plVar11, plVar3 != (lyd_node_inner *)0x0) {
                      plVar11 = plVar3;
                      plVar4 = (plVar3->field_0).node.parent;
                    }
                  }
                  if (*(lysc_node **)((long)&plVar11->field_0 + 8) == (lysc_node *)0x0) {
                    plVar8 = (lys_module *)((long)(plVar11 + 1) + 0x30);
                  }
                  else {
                    plVar8 = (*(lysc_node **)((long)&plVar11->field_0 + 8))->module;
                  }
                  err = lyd_new_meta(plVar8->ctx,(lyd_node *)plVar11,(lys_module *)0x0,
                                     "yang:operation","none",0,(lyd_meta **)0x0);
                  if (err == LY_SUCCESS) {
                    err = lyd_diff_merge_all(pplVar9,(lyd_node *)local_88,1);
                  }
                }
              }
            }
            else {
              if (local_a0->schema == (lysc_node *)0x0) {
                plVar8 = (lys_module *)&local_a0[2].schema;
              }
              else {
                plVar8 = local_a0->schema->module;
              }
              eitem = ly_err_first(plVar8->ctx);
              if (eitem == (ly_err_item *)0x0) {
                lyplg_ext_compile_log
                          ((lysc_ctx *)0x0,ext,LY_LLERR,err,
                           "Unknown validation error (err code %d).",(ulong)err);
              }
              else {
                lyplg_ext_compile_log_err(eitem,ext);
              }
            }
          }
        }
      }
      else if (local_98 != (ly_set *)0x0) {
        if (local_98->count != 0) {
          lyd_free_siblings(*(local_98->field_2).dnodes);
        }
        ly_set_free(local_98,(_func_void_void_ptr *)0x0);
        local_98 = (ly_set *)0x0;
      }
    }
LAB_0019f579:
    ly_set_free(local_98,(_func_void_void_ptr *)0x0);
    lyd_free_siblings((lyd_node *)0x0);
    lyd_free_tree(local_80);
    lyd_free_all((lyd_node *)local_88);
    if (local_a9 != '\0') {
      lyd_free_all(local_58);
    }
  }
  return err;
}

Assistant:

static LY_ERR
schema_mount_validate(struct lysc_ext_instance *ext, struct lyd_node *sibling, const struct lyd_node *dep_tree,
        enum lyd_type data_type, uint32_t val_opts, struct lyd_node **diff)
{
    LY_ERR ret = LY_SUCCESS;
    uint32_t *prev_lo, temp_lo = LY_LOSTORE_LAST, i;
    const struct ly_err_item *err;
    struct lyd_node *iter, *ext_data = NULL, *ref_first = NULL, *orig_parent = lyd_parent(sibling), *op_tree;
    struct lyd_node *ext_diff = NULL, *diff_parent = NULL;
    ly_bool ext_data_free = 0;
    struct ly_set *ref_set = NULL;

    if (!sibling) {
        /* some data had to be parsed for this callback to be called */
        EXT_LOGERR_INT_RET(NULL, ext);
    }

    /* get operational data with ietf-yang-library and ietf-yang-schema-mount data */
    if ((ret = lyplg_ext_get_data(ext->module->ctx, ext, (void **)&ext_data, &ext_data_free))) {
        goto cleanup;
    }

    LY_LIST_FOR(ext_data, iter) {
        if (iter->flags & LYD_NEW) {
            /* must be validated for the parent-reference prefix data to be stored */
            lyplg_ext_compile_log(NULL, ext, LY_LLERR, LY_EINVAL, "Provided ext data have not been validated.");
            ret = LY_EINVAL;
            goto cleanup;
        }
    }

    /* duplicate the referenced parent nodes into ext context */
    if ((ret = schema_mount_dup_parent_ref(ext, orig_parent, ext_data, LYD_CTX(sibling), &ref_set))) {
        goto cleanup;
    }

    if (data_type != LYD_TYPE_DATA_YANG) {
        /* remember the operation data tree, it may be moved */
        op_tree = sibling;
    }

    /* create accessible tree, remove LYD_EXT to not call this callback recursively */
    LY_CHECK_GOTO(lyd_unlink_siblings(sibling), cleanup);
    LY_LIST_FOR(sibling, iter) {
        iter->flags &= ~LYD_EXT;
    }
    if (ref_set->count) {
        if ((ret = lyd_insert_sibling(sibling, ref_set->dnodes[0], &sibling))) {
            goto cleanup;
        }
    }

    /* only store messages in the context, log as an extension */
    prev_lo = ly_temp_log_options(&temp_lo);

    if (data_type == LYD_TYPE_DATA_YANG) {
        /* validate all the modules with data */
        ret = lyd_validate_all(&sibling, NULL, val_opts | LYD_VALIDATE_PRESENT, diff ? &ext_diff : NULL);
    } else {
        /* validate the operation */
        ret = lyd_validate_op(op_tree, dep_tree, data_type, diff ? &ext_diff : NULL);
    }

    /* restore logging */
    ly_temp_log_options(prev_lo);

    /* restore sibling tree */
    for (i = 0; i < ref_set->count; ++i) {
        if (ref_set->dnodes[i] == sibling) {
            sibling = sibling->next;
        }
        lyd_free_tree(ref_set->dnodes[i]);
    }
    LY_LIST_FOR(sibling, iter) {
        iter->flags |= LYD_EXT;
    }
    lyplg_ext_insert(orig_parent, sibling);

    if (ret) {
        /* log the error in the original context */
        err = ly_err_first(LYD_CTX(sibling));
        if (!err) {
            lyplg_ext_compile_log(NULL, ext, LY_LLERR, ret, "Unknown validation error (err code %d).", ret);
        } else {
            lyplg_ext_compile_log_err(err, ext);
        }
        goto cleanup;
    }

    /* create proper diff */
    if (diff && ext_diff) {
        /* diff nodes from an extension instance */
        LY_LIST_FOR(ext_diff, iter) {
            iter->flags |= LYD_EXT;
        }

        /* create the parent and insert the diff */
        if ((ret = lyd_dup_single(lyd_parent(sibling), NULL, LYD_DUP_WITH_PARENTS | LYD_DUP_NO_META, &diff_parent))) {
            goto cleanup;
        }
        if ((ret = lyplg_ext_insert(diff_parent, ext_diff))) {
            goto cleanup;
        }
        ext_diff = NULL;

        /* go top-level and set the operation */
        while (lyd_parent(diff_parent)) {
            diff_parent = lyd_parent(diff_parent);
        }
        if ((ret = lyd_new_meta(LYD_CTX(diff_parent), diff_parent, NULL, "yang:operation", "none", 0, NULL))) {
            goto cleanup;
        }

        /* finally merge into the global diff */
        if ((ret = lyd_diff_merge_all(diff, diff_parent, LYD_DIFF_MERGE_DEFAULTS))) {
            goto cleanup;
        }
    }

cleanup:
    ly_set_free(ref_set, NULL);
    lyd_free_siblings(ref_first);
    lyd_free_tree(ext_diff);
    lyd_free_all(diff_parent);
    if (ext_data_free) {
        lyd_free_all(ext_data);
    }
    return ret;
}